

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Main.cpp
# Opt level: O0

uint threadProc(void *param)

{
  uint uVar1;
  char *local_38;
  char *local_28;
  uint local_1c;
  int counter;
  Signal *termSignal;
  void *param_local;
  
  local_1c = 0;
  while( true ) {
    uVar1 = Signal::wait((Signal *)param,(void *)0x3e8);
    if (((uVar1 ^ 0xff) & 1) == 0) break;
    if ((int)local_1c % 5 == 0) {
      if ((int)(local_1c + 1) % 3 == 0) {
        local_28 = "\n";
      }
      else {
        local_28 = " ";
      }
      Console::errorf("%d%s",(ulong)local_1c,local_28);
    }
    else {
      if ((int)(local_1c + 1) % 3 == 0) {
        local_38 = "\n";
      }
      else {
        local_38 = " ";
      }
      Console::printf("%d%s",(ulong)local_1c,local_38);
    }
    local_1c = local_1c + 1;
  }
  return 0;
}

Assistant:

uint threadProc(void* param)
{
  Signal* termSignal = (Signal*)param;
  int counter = 0;
  while(!termSignal->wait(1000))
  {
    if(counter % 5 == 0)
      Console::errorf("%d%s", counter, ((counter + 1) % 3) == 0 ? "\n" : " ");
    else
      Console::printf("%d%s", counter, ((counter + 1) % 3) == 0 ? "\n" : " ");
    ++counter;
  }
  return 0;
}